

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,1,_1,1,1,_1>>
               (Matrix<double,_1,__1,_1,_1,__1> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
               *src,assign_op<double,_double> *func)

{
  Scalar *__first;
  Index __n;
  scalar_constant_op<double> *this;
  double local_28;
  assign_op<double,_double> *local_20;
  assign_op<double,_double> *func_local;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
  *src_local;
  Matrix<double,_1,__1,_1,_1,__1> *dst_local;
  
  local_20 = func;
  func_local = (assign_op<double,_double> *)src;
  src_local = (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
               *)dst;
  resize_if_allowed<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>,double,double>
            (dst,src,func);
  __first = PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::data
                      ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)src_local);
  __n = EigenBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::size
                  ((EigenBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)src_local);
  this = CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
         ::functor((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                    *)func_local);
  local_28 = scalar_constant_op<double>::operator()(this);
  std::fill_n<double*,long,double>(__first,__n,&local_28);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<typename DstXprType::Scalar>, DstXprType>& src, const internal::assign_op<typename DstXprType::Scalar,typename DstXprType::Scalar>& func)
{
  resize_if_allowed(dst, src, func);
  std::fill_n(dst.data(), dst.size(), src.functor()());
}